

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O2

double __thiscall HMatrix::compute_dot(HMatrix *this,HVector *vector,int iCol)

{
  pointer piVar1;
  long lVar2;
  double dVar3;
  
  if (iCol < this->numCol) {
    piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar3 = 0.0;
    for (lVar2 = (long)piVar1[iCol]; lVar2 < piVar1[(long)iCol + 1]; lVar2 = lVar2 + 1) {
      dVar3 = dVar3 + (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar2]] *
                      (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar2];
    }
  }
  else {
    dVar3 = (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iCol - this->numCol];
  }
  return dVar3;
}

Assistant:

double HMatrix::compute_dot(HVector& vector, int iCol) const {
    double result = 0;
    if (iCol < numCol) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
            result += vector.array[Aindex[k]] * Avalue[k];
    } else {
        result = vector.array[iCol - numCol];
    }
    return result;
}